

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UartSerial.cpp
# Opt level: O3

int __thiscall
serial_wiring::UartSerial::_registerSerialEventCallback
          (UartSerial *this,serial_event_t uponBytesAvailable_,void *context_)

{
  thread local_28;
  UartSerial *local_20;
  code *local_18;
  undefined8 local_10;
  
  if (this->_serial_file_descriptor == -1) {
    perror("UartSerial::registerSerialEventCallback - Invalid file descriptor");
  }
  else {
    this->_bytesAvailableCallback = uponBytesAvailable_;
    this->_bytes_available_context = context_;
    if ((uponBytesAvailable_ != (serial_event_t)0x0) && (((this->_polling)._M_base._M_i & 1U) == 0))
    {
      local_18 = pollForSerialData;
      local_10 = 0;
      local_20 = this;
      std::thread::thread<void(serial_wiring::UartSerial::*)(),serial_wiring::UartSerial*,void>
                (&local_28,(offset_in_UartSerial_to_subr *)&local_18,&local_20);
      if ((this->_poll_thread)._M_id._M_thread != 0) {
        std::terminate();
      }
      (this->_poll_thread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
    }
  }
  return 0;
}

Assistant:

int
UartSerial::_registerSerialEventCallback (
    serial_event_t uponBytesAvailable_,
    void * context_
) {
    if ( -1 == _serial_file_descriptor ) {
        ::perror("UartSerial::registerSerialEventCallback - Invalid file descriptor");
    } else {
        _bytesAvailableCallback = uponBytesAvailable_;
        _bytes_available_context = context_;

        if ( _bytesAvailableCallback && !_polling ) {
            _poll_thread = std::thread(&UartSerial::pollForSerialData, this);
        }
    }
    return 0;
}